

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

char * bc_strdup(char *s)

{
  size_t sVar1;
  void *__dest;
  char *pcVar2;
  
  if (s != (char *)0x0) {
    sVar1 = strlen(s);
    __dest = malloc(sVar1 + 1);
    if (__dest != (void *)0x0) {
      pcVar2 = (char *)memcpy(__dest,s,sVar1 + 1);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

char*
bc_strdup(const char *s)
{
    if (s == NULL)
        return NULL;
    size_t l = strlen(s);
    char *tmp = malloc(l + 1);
    if (tmp == NULL)
        return NULL;
    memcpy(tmp, s, l + 1);
    return tmp;
}